

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall
InterpGCTest_Collect_GlobalCycle_Test::InterpGCTest_Collect_GlobalCycle_Test
          (InterpGCTest_Collect_GlobalCycle_Test *this)

{
  Features local_1a;
  
  testing::Test::Test((Test *)this);
  (this->super_InterpGCTest).super_InterpTest.super_Test._vptr_Test =
       (_func_int **)&PTR__InterpTest_0023ae38;
  local_1a.exceptions_enabled_ = false;
  local_1a.mutable_globals_enabled_ = true;
  local_1a.sat_float_to_int_enabled_ = true;
  local_1a.sign_extension_enabled_ = true;
  local_1a.simd_enabled_ = true;
  local_1a.threads_enabled_ = false;
  local_1a.function_references_enabled_ = false;
  local_1a.multi_value_enabled_ = true;
  local_1a.tail_call_enabled_ = false;
  local_1a.bulk_memory_enabled_ = true;
  local_1a.reference_types_enabled_ = true;
  local_1a.annotations_enabled_ = false;
  local_1a.code_metadata_enabled_ = false;
  local_1a.gc_enabled_ = false;
  local_1a.memory64_enabled_ = false;
  local_1a.multi_memory_enabled_ = false;
  local_1a.extended_const_enabled_ = false;
  local_1a.relaxed_simd_enabled_ = false;
  wabt::interp::Store::Store(&(this->super_InterpGCTest).super_InterpTest.store_,&local_1a);
  memset(&(this->super_InterpGCTest).super_InterpTest.module_desc_,0,0x150);
  (this->super_InterpGCTest).super_InterpTest.super_Test._vptr_Test =
       (_func_int **)&PTR__InterpTest_0023ab38;
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_GlobalCycle) {
  auto gt = GlobalType{ValueType::ExternRef, Mutability::Var};
  auto g1 = Global::New(store_, gt, Value::Make(Ref::Null));
  auto g2 = Global::New(store_, gt, Value::Make(g1->self()));
  g1->Set(store_, g2->self());

  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 2, after_new);

  // Remove g1 root, but it's kept alive by g2.
  g1.reset();
  store_.Collect();
  EXPECT_EQ(after_new, store_.object_count());

  // Remove g2 root, now both should be removed.
  g2.reset();
}